

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_socket.cpp
# Opt level: O0

int setReceiveBufferSize(SOCKET sockfd,int size)

{
  int iVar1;
  uint in_ESI;
  int in_EDI;
  socklen_t optval_size;
  int optval;
  socklen_t local_14;
  uint local_10;
  uint local_c;
  int local_8;
  int local_4;
  
  local_14 = 4;
  local_10 = in_ESI;
  local_c = in_ESI;
  local_8 = in_EDI;
  iVar1 = setsockopt(in_EDI,1,8,&local_10,4);
  if (iVar1 == -1) {
    LogMessage(1,"%s: setting receive buffer size failed");
  }
  iVar1 = getsockopt(local_8,1,8,&local_10,&local_14);
  if (iVar1 == -1) {
    LogMessage(1,"%s: getting receive buffer size failed");
  }
  if (local_10 == local_c) {
    local_4 = 0;
  }
  else {
    LogMessage(2,"%s, ReceiveBuffer size is %d, but set %d","int setReceiveBufferSize(SOCKET, int)",
               (ulong)local_10,(ulong)local_c);
    local_4 = 6;
  }
  return local_4;
}

Assistant:

int setReceiveBufferSize(SOCKET sockfd, int size)
{
  // Large 1MB Buffer for receiving so we don't lose data.
  int optval = size;
  socklen_t optval_size = sizeof(int);
  if (setsockopt(sockfd, SOL_SOCKET, SO_RCVBUF, (char *) &optval,
             optval_size) == SOCKET_ERROR) {
    LogMessage(VL_Error, "%s: setting receive buffer size failed");
  }
  if (getsockopt(sockfd, SOL_SOCKET, SO_RCVBUF, (char *) &optval,
             &optval_size) == SOCKET_ERROR) {
    LogMessage(VL_Error, "%s: getting receive buffer size failed");
  }
  if (optval != size) {
    LogMessage(VL_Warning,
               "%s, ReceiveBuffer size is %d, but set %d", __PRETTY_FUNCTION__, optval, size);
    return RC_Unrecognized;
  }
  return RC_Okay;
}